

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O2

actions_fun * __thiscall
estl::state_machine<cdplayer>::get_action_function
          (actions_fun *__return_storage_ptr__,state_machine<cdplayer> *this,state_type from_state)

{
  __normal_iterator<const_estl::state_machine<cdplayer>::action_entry_*,_std::vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>_>
  _Var1;
  state_type local_14;
  
  local_14 = from_state;
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<estl::state_machine<cdplayer>::action_entry_const*,std::vector<estl::state_machine<cdplayer>::action_entry,std::allocator<estl::state_machine<cdplayer>::action_entry>>>,cdplayer::state_type,__gnu_cxx::__ops::_Iter_comp_val<estl::state_machine<cdplayer>::get_action_function(cdplayer::state_type)const::_lambda(estl::state_machine<cdplayer>::action_entry_const&,cdplayer::state_type)_1_>>
                    ((this->actions_).
                     super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->actions_).
                     super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_14);
  if ((_Var1._M_current ==
       (this->actions_).
       super__Vector_base<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish) || ((_Var1._M_current)->state != local_14)) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    std::function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)>::function
              (__return_storage_ptr__,&(_Var1._M_current)->do_actions);
  }
  return __return_storage_ptr__;
}

Assistant:

actions_fun get_action_function(state_type from_state) const
    {
        constexpr auto compare = [](const action_entry& lhs, state_type state) -> bool {
            return lhs.state < state;
        };

        const auto it = std::lower_bound(actions_.begin(), actions_.end(), from_state, compare);
        if (it != actions_.end() && it->state == from_state) {
            return it->do_actions;
        }
        return nullptr;
    }